

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O3

FT_Error ps_dimension_end(PS_Dimension dim,FT_UInt end_point,FT_Memory memory)

{
  PS_Mask __dest;
  undefined4 uVar1;
  PS_Mask pPVar2;
  byte *pbVar3;
  byte *pbVar4;
  FT_Byte *pFVar5;
  FT_Byte *pFVar6;
  bool bVar7;
  FT_UInt FVar8;
  FT_UInt FVar9;
  undefined4 uVar10;
  FT_Error FVar11;
  FT_UInt FVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  byte *pbVar19;
  ulong uVar20;
  byte *pbVar21;
  long lVar22;
  ulong uVar23;
  undefined4 uStack_60;
  
  uVar13 = (ulong)(dim->masks).num_masks;
  if (uVar13 != 0) {
    (dim->masks).masks[uVar13 - 1].end_point = end_point;
  }
  uVar16 = (dim->counters).num_masks;
  if (1 < (long)(int)uVar16) {
    uVar15 = (ulong)(uVar16 - 2);
    uVar13 = (long)(int)uVar16;
    do {
      uVar23 = uVar13 - 1;
      pPVar2 = (dim->counters).masks;
      pbVar3 = pPVar2[uVar23].bytes;
      uVar18 = uVar15;
      do {
        pbVar4 = pPVar2[uVar18].bytes;
        uVar14 = pPVar2[uVar18].num_bits;
        if (pPVar2[uVar23].num_bits < pPVar2[uVar18].num_bits) {
          uVar14 = pPVar2[uVar23].num_bits;
        }
        uVar17 = (uint)uVar18;
        pbVar21 = pbVar4;
        pbVar19 = pbVar3;
        if (7 < uVar14) {
          uVar20 = (ulong)(uVar14 - 8 >> 3);
          pbVar19 = pbVar3 + uVar20 + 1;
          pbVar21 = pbVar4 + uVar20 + 1;
          lVar22 = 0;
          do {
            if ((pbVar3[lVar22] & pbVar4[lVar22]) != 0) goto LAB_001587c4;
            uVar14 = uVar14 - 8;
            lVar22 = lVar22 + 1;
          } while (7 < uVar14);
        }
        if ((uVar14 != 0) && (0xffU >> ((byte)uVar14 & 0x1f) < (uint)(*pbVar21 & *pbVar19))) {
LAB_001587c4:
          uVar14 = (uint)uVar23;
          uVar20 = uVar23;
          if (uVar14 < uVar17) {
            uVar20 = uVar18;
          }
          if (uVar14 <= uVar17) {
            uVar17 = uVar14;
          }
          uVar14 = (uint)uVar20;
          if ((uVar17 < uVar14) && (uVar14 < uVar16)) {
            __dest = pPVar2 + (uVar20 & 0xffffffff);
            FVar12 = __dest->num_bits;
            if (FVar12 != 0) {
              pPVar2 = pPVar2 + uVar17;
              uVar16 = pPVar2->num_bits;
              if (uVar16 < FVar12) {
                FVar11 = ps_mask_ensure(pPVar2,FVar12,memory);
                if (FVar11 != 0) {
                  return FVar11;
                }
                do {
                  if (uVar16 < pPVar2->num_bits) {
                    pPVar2->bytes[uVar16 >> 3] =
                         pPVar2->bytes[uVar16 >> 3] & (byte)(-0x81 >> ((byte)uVar16 & 7));
                  }
                  uVar16 = uVar16 + 1;
                } while (FVar12 != uVar16);
              }
              if (7 < FVar12 + 7) {
                pFVar5 = pPVar2->bytes;
                pFVar6 = __dest->bytes;
                lVar22 = 0;
                do {
                  pFVar5[lVar22] = pFVar5[lVar22] | pFVar6[lVar22];
                  lVar22 = lVar22 + 1;
                } while (FVar12 + 7 >> 3 != (uint)lVar22);
              }
            }
            __dest->num_bits = 0;
            __dest->end_point = 0;
            FVar12 = (dim->counters).num_masks;
            uVar18 = (ulong)(~uVar14 + FVar12);
            if (0 < (int)(~uVar14 + FVar12)) {
              FVar9 = __dest->end_point;
              uVar10 = *(undefined4 *)&__dest->field_0x14;
              FVar12 = __dest->num_bits;
              FVar8 = __dest->max_bits;
              uStack_60 = (undefined4)((ulong)*(undefined8 *)&__dest->max_bits >> 0x20);
              uVar1 = *(undefined4 *)((long)&__dest->bytes + 4);
              memmove(__dest,__dest + 1,uVar18 * 0x18);
              pPVar2 = __dest + uVar18;
              pPVar2->num_bits = FVar12;
              pPVar2->max_bits = FVar8;
              pPVar2->bytes = (FT_Byte *)CONCAT44(uVar1,uStack_60);
              __dest[uVar18].end_point = FVar9;
              *(undefined4 *)&__dest[uVar18].field_0x14 = uVar10;
              FVar12 = (dim->counters).num_masks;
            }
            uVar16 = FVar12 - 1;
            (dim->counters).num_masks = uVar16;
          }
          break;
        }
        uVar18 = uVar18 - 1;
      } while (0 < (int)uVar17);
      uVar15 = uVar15 - 1;
      bVar7 = 2 < (long)uVar13;
      uVar13 = uVar23;
    } while (bVar7);
  }
  return 0;
}

Assistant:

static FT_Error
  ps_dimension_end( PS_Dimension  dim,
                    FT_UInt       end_point,
                    FT_Memory     memory )
  {
    /* end hint mask table */
    ps_dimension_end_mask( dim, end_point );

    /* merge all counter masks into independent "paths" */
    return ps_mask_table_merge_all( &dim->counters, memory );
  }